

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack4.h
# Opt level: O0

void ncnn::padding_replicate_pack4_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float *outptr;
  float *ptr;
  int local_204;
  int local_200;
  int local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_198;
  int local_18c;
  undefined8 *local_188;
  undefined8 *local_180;
  int x_8;
  int x_7;
  int x_6;
  __m128 _p_2;
  float *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  __m128 _p_1;
  int y_1;
  int x_2;
  int x_1;
  int x;
  __m128 _p;
  float *ptr0;
  int y;
  
  local_180 = (undefined8 *)*in_RDI;
  local_188 = (undefined8 *)*in_RSI;
  for (local_18c = 0; local_18c < in_EDX; local_18c = local_18c + 1) {
    local_1a8 = *local_180;
    uStack_1a0 = local_180[1];
    for (local_1ac = 0; local_1ac < in_R8D; local_1ac = local_1ac + 1) {
      *local_188 = local_1a8;
      local_188[1] = uStack_1a0;
      local_188 = local_188 + 2;
    }
    local_198 = local_180;
    for (local_1b0 = 0; local_1b0 < *(int *)((long)in_RDI + 0x2c); local_1b0 = local_1b0 + 1) {
      local_1a8 = *local_198;
      uStack_1a0 = local_198[1];
      *local_188 = local_1a8;
      local_188[1] = uStack_1a0;
      local_198 = local_198 + 2;
      local_188 = local_188 + 2;
    }
    for (local_1b4 = 0; local_1b4 < in_R9D; local_1b4 = local_1b4 + 1) {
      *local_188 = local_1a8;
      local_188[1] = uStack_1a0;
      local_188 = local_188 + 2;
    }
  }
  for (local_1b8 = 0; local_1b8 < (int)in_RDI[6]; local_1b8 = local_1b8 + 1) {
    local_1c8 = *local_180;
    uStack_1c0 = local_180[1];
    for (local_1cc = 0; local_1cc < in_R8D; local_1cc = local_1cc + 1) {
      *local_188 = local_1c8;
      local_188[1] = uStack_1c0;
      local_188 = local_188 + 2;
    }
    for (local_1d0 = 0; local_1d0 < *(int *)((long)in_RDI + 0x2c); local_1d0 = local_1d0 + 1) {
      local_1c8 = *local_180;
      uStack_1c0 = local_180[1];
      *local_188 = local_1c8;
      local_188[1] = uStack_1c0;
      local_180 = local_180 + 2;
      local_188 = local_188 + 2;
    }
    for (local_1d4 = 0; local_1d4 < in_R9D; local_1d4 = local_1d4 + 1) {
      *local_188 = local_1c8;
      local_188[1] = uStack_1c0;
      local_188 = local_188 + 2;
    }
  }
  local_180 = (undefined8 *)((long)local_180 + (long)(*(int *)((long)in_RDI + 0x2c) << 2) * -4);
  for (local_1d8 = 0; local_1d8 < in_ECX; local_1d8 = local_1d8 + 1) {
    local_1f8 = *local_180;
    uStack_1f0 = local_180[1];
    for (local_1fc = 0; local_1fc < in_R8D; local_1fc = local_1fc + 1) {
      *local_188 = local_1f8;
      local_188[1] = uStack_1f0;
      local_188 = local_188 + 2;
    }
    local_1e0 = local_180;
    for (local_200 = 0; local_200 < *(int *)((long)in_RDI + 0x2c); local_200 = local_200 + 1) {
      local_1f8 = *local_1e0;
      uStack_1f0 = local_1e0[1];
      *local_188 = local_1f8;
      local_188[1] = uStack_1f0;
      local_1e0 = local_1e0 + 2;
      local_188 = local_188 + 2;
    }
    for (local_204 = 0; local_204 < in_R9D; local_204 = local_204 + 1) {
      *local_188 = local_1f8;
      local_188[1] = uStack_1f0;
      local_188 = local_188 + 2;
    }
  }
  return;
}

Assistant:

static void padding_replicate_pack4_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        __m128 _p = _mm_load_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        __m128 _p = _mm_load_ps(ptr);
        for (int x = 0; x < left; x++)
        {
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm_load_ps(ptr);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill bottom
    ptr -= src.w * 4;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        __m128 _p = _mm_load_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
    }
}